

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O0

void __thiscall leveldb::SnapshotList::Delete(SnapshotList *this,SnapshotImpl *snapshot)

{
  SnapshotImpl *snapshot_local;
  SnapshotList *this_local;
  
  if (snapshot->list_ == this) {
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    if (snapshot != (SnapshotImpl *)0x0) {
      (*(snapshot->super_Snapshot)._vptr_Snapshot[1])();
    }
    return;
  }
  __assert_fail("snapshot->list_ == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/snapshot.h"
                ,0x51,"void leveldb::SnapshotList::Delete(const SnapshotImpl *)");
}

Assistant:

void Delete(const SnapshotImpl* snapshot) {
#if !defined(NDEBUG)
    assert(snapshot->list_ == this);
#endif  // !defined(NDEBUG)
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    delete snapshot;
  }